

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O1

void proto2_unittest::TestParsingMergeLite::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  MessageLite *pMVar2;
  MessageLite *to_msg_00;
  ulong uVar3;
  void *pvVar4;
  _func_int **pp_Var5;
  Nonnull<const_char_*> pcVar6;
  Arena *arena;
  
  arena = (Arena *)(to_msg->_internal_metadata_).ptr_;
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  if (from_msg == to_msg) {
    pcVar6 = absl::lts_20250127::log_internal::MakeCheckOpString<void_const*,void_const*>
                       (from_msg,to_msg,"&from != _this");
  }
  else {
    pcVar6 = (Nonnull<const_char_*>)0x0;
  }
  if (pcVar6 != (Nonnull<const_char_*>)0x0) goto LAB_001c5eb8;
  if ((int)from_msg[3]._internal_metadata_.ptr_ != 0) {
    google::protobuf::internal::RepeatedPtrFieldBase::MergeFrom<google::protobuf::MessageLite>
              ((RepeatedPtrFieldBase *)(to_msg + 3),(RepeatedPtrFieldBase *)(from_msg + 3));
  }
  if (*(int *)&from_msg[5]._vptr_MessageLite != 0) {
    google::protobuf::internal::RepeatedPtrFieldBase::MergeFrom<google::protobuf::MessageLite>
              ((RepeatedPtrFieldBase *)&to_msg[4]._internal_metadata_,
               (RepeatedPtrFieldBase *)&from_msg[4]._internal_metadata_);
  }
  uVar1 = (uint)from_msg[2]._internal_metadata_.ptr_;
  if ((uVar1 & 7) == 0) goto LAB_001c5e2d;
  if ((uVar1 & 1) == 0) {
LAB_001c5dcf:
    if ((uVar1 & 2) != 0) {
      pMVar2 = (MessageLite *)from_msg[6]._internal_metadata_.ptr_;
      if (pMVar2 == (MessageLite *)0x0) goto LAB_001c5ea4;
      to_msg_00 = (MessageLite *)to_msg[6]._internal_metadata_.ptr_;
      if (to_msg_00 == (MessageLite *)0x0) {
        pvVar4 = google::protobuf::Arena::CopyConstruct<proto2_unittest::TestAllTypesLite>
                           (arena,pMVar2);
        to_msg[6]._internal_metadata_.ptr_ = (intptr_t)pvVar4;
      }
      else {
        TestAllTypesLite::MergeImpl(to_msg_00,pMVar2);
      }
    }
    if ((uVar1 & 4) == 0) {
LAB_001c5e2d:
      *(uint *)&to_msg[2]._internal_metadata_.ptr_ =
           (uint)to_msg[2]._internal_metadata_.ptr_ | uVar1;
      google::protobuf::internal::ExtensionSet::MergeFrom
                ((ExtensionSet *)(to_msg + 1),(MessageLite *)_TestParsingMergeLite_default_instance_
                 ,(ExtensionSet *)(from_msg + 1));
      uVar3 = (from_msg->_internal_metadata_).ptr_;
      if ((uVar3 & 1) == 0) {
        return;
      }
      google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
                (&to_msg->_internal_metadata_,(string *)((uVar3 & 0xfffffffffffffffe) + 8));
      return;
    }
    pMVar2 = (MessageLite *)from_msg[7]._vptr_MessageLite;
    if (pMVar2 != (MessageLite *)0x0) {
      if ((MessageLite *)to_msg[7]._vptr_MessageLite == (MessageLite *)0x0) {
        pp_Var5 = (_func_int **)
                  google::protobuf::Arena::
                  CopyConstruct<proto2_unittest::TestParsingMergeLite_OptionalGroup>(arena,pMVar2);
        to_msg[7]._vptr_MessageLite = pp_Var5;
      }
      else {
        TestParsingMergeLite_OptionalGroup::MergeImpl
                  ((MessageLite *)to_msg[7]._vptr_MessageLite,pMVar2);
      }
      goto LAB_001c5e2d;
    }
  }
  else {
    pMVar2 = (MessageLite *)from_msg[6]._vptr_MessageLite;
    if (pMVar2 != (MessageLite *)0x0) {
      if ((MessageLite *)to_msg[6]._vptr_MessageLite == (MessageLite *)0x0) {
        pp_Var5 = (_func_int **)
                  google::protobuf::Arena::CopyConstruct<proto2_unittest::TestAllTypesLite>
                            (arena,pMVar2);
        to_msg[6]._vptr_MessageLite = pp_Var5;
      }
      else {
        TestAllTypesLite::MergeImpl((MessageLite *)to_msg[6]._vptr_MessageLite,pMVar2);
      }
      goto LAB_001c5dcf;
    }
    MergeImpl((TestParsingMergeLite *)&stack0xffffffffffffffd0);
LAB_001c5ea4:
    MergeImpl((TestParsingMergeLite *)&stack0xffffffffffffffd0);
  }
  MergeImpl((TestParsingMergeLite *)&stack0xffffffffffffffd0);
LAB_001c5eb8:
  MergeImpl();
}

Assistant:

void TestParsingMergeLite::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<TestParsingMergeLite*>(&to_msg);
  auto& from = static_cast<const TestParsingMergeLite&>(from_msg);
  ::google::protobuf::Arena* arena = _this->GetArena();
  // @@protoc_insertion_point(class_specific_merge_from_start:proto2_unittest.TestParsingMergeLite)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  _this->_internal_mutable_repeated_all_types()->MergeFrom(
      from._internal_repeated_all_types());
  _this->_internal_mutable_repeatedgroup()->MergeFrom(
      from._internal_repeatedgroup());
  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000007u) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      ABSL_DCHECK(from._impl_.required_all_types_ != nullptr);
      if (_this->_impl_.required_all_types_ == nullptr) {
        _this->_impl_.required_all_types_ = ::google::protobuf::MessageLite::CopyConstruct(arena, *from._impl_.required_all_types_);
      } else {
        _this->_impl_.required_all_types_->MergeFrom(*from._impl_.required_all_types_);
      }
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      ABSL_DCHECK(from._impl_.optional_all_types_ != nullptr);
      if (_this->_impl_.optional_all_types_ == nullptr) {
        _this->_impl_.optional_all_types_ = ::google::protobuf::MessageLite::CopyConstruct(arena, *from._impl_.optional_all_types_);
      } else {
        _this->_impl_.optional_all_types_->MergeFrom(*from._impl_.optional_all_types_);
      }
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      ABSL_DCHECK(from._impl_.optionalgroup_ != nullptr);
      if (_this->_impl_.optionalgroup_ == nullptr) {
        _this->_impl_.optionalgroup_ = ::google::protobuf::MessageLite::CopyConstruct(arena, *from._impl_.optionalgroup_);
      } else {
        _this->_impl_.optionalgroup_->MergeFrom(*from._impl_.optionalgroup_);
      }
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_impl_._extensions_.MergeFrom(&default_instance(), from._impl_._extensions_);
  _this->_internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
}